

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

int Abc_NtkIsDfsOrdered(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  undefined4 uVar2;
  long *plVar3;
  long lVar4;
  int *__s;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  Vec_Ptr_t *extraout_RDX_02;
  Vec_Ptr_t *extraout_RDX_03;
  char *__assertion;
  long lVar7;
  long *plVar8;
  int iVar9;
  long lVar10;
  
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar6 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar6 + 500;
    iVar9 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar9) {
      __s = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar9;
      in_RDX = extraout_RDX;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar6) {
      memset(__s,0,(uVar1 & 0xffffffff) << 2);
      in_RDX = extraout_RDX_00;
    }
    (pNtk->vTravIds).nSize = iVar9;
  }
  iVar6 = pNtk->nTravIds;
  pNtk->nTravIds = iVar6 + 1;
  if (0x3ffffffe < iVar6) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                  ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar5 = pNtk->vCis;
  if (0 < pVVar5->nSize) {
    lVar10 = 0;
    do {
      lVar7 = *pVVar5->pArray[lVar10];
      iVar6 = (int)*(long *)((long)pVVar5->pArray[lVar10] + 0x10);
      uVar2 = *(undefined4 *)(lVar7 + 0xd8);
      Vec_IntFillExtra((Vec_Int_t *)(lVar7 + 0xe0),iVar6 + 1,(int)in_RDX);
      if (((long)iVar6 < 0) || (*(int *)(lVar7 + 0xe4) <= iVar6)) goto LAB_001c20c6;
      *(undefined4 *)(*(long *)(lVar7 + 0xe8) + (long)iVar6 * 4) = uVar2;
      lVar10 = lVar10 + 1;
      pVVar5 = pNtk->vCis;
      in_RDX = extraout_RDX_01;
    } while (lVar10 < pVVar5->nSize);
  }
  pVVar5 = pNtk->vObjs;
  if (0 < pVVar5->nSize) {
    lVar10 = 0;
    do {
      plVar3 = (long *)pVVar5->pArray[lVar10];
      if ((plVar3 != (long *)0x0) && ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 7)) {
        if (0 < *(int *)((long)plVar3 + 0x1c)) {
          lVar7 = 0;
          do {
            plVar8 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                               (long)*(int *)(plVar3[4] + lVar7 * 4) * 8);
            lVar4 = *plVar8;
            iVar6 = (int)plVar8[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar4 + 0xe0),iVar6 + 1,(int)pVVar5);
            if (((long)iVar6 < 0) || (*(int *)(lVar4 + 0xe4) <= iVar6)) goto LAB_001c20e5;
            if (*(int *)(*(long *)(lVar4 + 0xe8) + (long)iVar6 * 4) != *(int *)(*plVar8 + 0xd8)) {
              return 0;
            }
            lVar7 = lVar7 + 1;
            pVVar5 = extraout_RDX_02;
          } while (lVar7 < *(int *)((long)plVar3 + 0x1c));
        }
        iVar6 = (int)pVVar5;
        if (pNtk->ntkType == ABC_NTK_STRASH) {
          if (((ulong)plVar3 & 1) != 0) {
            __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_001c2133:
            __assert_fail(__assertion,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                          ,399,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
          }
          if (*(int *)*plVar3 != 3) {
            __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
            goto LAB_001c2133;
          }
          if ((plVar3[7] != 0) && (plVar8 = plVar3, 0 < *(int *)((long)plVar3 + 0x2c))) {
            while( true ) {
              iVar6 = (int)pVVar5;
              plVar8 = (long *)plVar8[7];
              if (plVar8 == (long *)0x0) break;
              lVar7 = *plVar8;
              iVar9 = (int)plVar8[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar7 + 0xe0),iVar9 + 1,iVar6);
              if (((long)iVar9 < 0) || (*(int *)(lVar7 + 0xe4) <= iVar9)) {
LAB_001c20e5:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              pVVar5 = extraout_RDX_03;
              if (*(int *)(*(long *)(lVar7 + 0xe8) + (long)iVar9 * 4) != *(int *)(*plVar8 + 0xd8)) {
                return 0;
              }
            }
          }
        }
        lVar7 = *plVar3;
        iVar9 = (int)plVar3[2];
        uVar2 = *(undefined4 *)(lVar7 + 0xd8);
        Vec_IntFillExtra((Vec_Int_t *)(lVar7 + 0xe0),iVar9 + 1,iVar6);
        if (((long)iVar9 < 0) || (*(int *)(lVar7 + 0xe4) <= iVar9)) {
LAB_001c20c6:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(undefined4 *)(*(long *)(lVar7 + 0xe8) + (long)iVar9 * 4) = uVar2;
        pVVar5 = pNtk->vObjs;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar5->nSize);
  }
  return 1;
}

Assistant:

int Abc_NtkIsDfsOrdered( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode, * pFanin;
    int i, k;
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // mark the CIs
    Abc_NtkForEachCi( pNtk, pNode, i )
        Abc_NodeSetTravIdCurrent( pNode );
    // go through the nodes
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        // check the fanins of the node
        Abc_ObjForEachFanin( pNode, pFanin, k )
            if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                return 0;
        // check the choices of the node
        if ( Abc_NtkIsStrash(pNtk) && Abc_AigNodeIsChoice(pNode) )
            for ( pFanin = (Abc_Obj_t *)pNode->pData; pFanin; pFanin = (Abc_Obj_t *)pFanin->pData )
                if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                    return 0;
        // mark the node as visited
        Abc_NodeSetTravIdCurrent( pNode );
    }
    return 1;
}